

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePoly.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLinePoly::ArchiveOUT(ChLinePoly *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_38;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLinePoly>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_38._value = &this->points;
  local_38._name = "points";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&this->degree
  ;
  local_38._name = "degree";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

void ChLinePoly::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinePoly>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(points);
    marchive << CHNVP(degree);
}